

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_199c2b::StatTask::start(StatTask *this,TaskInterface ti)

{
  BuildKey local_68;
  long *local_48 [2];
  long local_38 [2];
  TaskInterface local_28;
  
  local_28.ctx = ti.ctx;
  local_28.impl = ti.impl;
  llbuild::buildsystem::BuildKey::BuildKey(&local_68,'N',*(StringRef *)this->statnode);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,local_68.key.key._M_dataplus._M_p,
             local_68.key.key._M_dataplus._M_p + local_68.key.key._M_string_length);
  llbuild::core::TaskInterface::mustFollow(&local_28,(KeyType *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.key.key._M_dataplus._M_p != &local_68.key.key.field_2) {
    operator_delete(local_68.key.key._M_dataplus._M_p,
                    local_68.key.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Create a weak link on any potential producer nodes so that we get up to
    // date stat information. We always run (see isResultValid) so this should
    // be safe (unlike directory contents where it may not run).
    ti.mustFollow(BuildKey::makeNode(statnode.getName()).toData());
  }